

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_ptr.h
# Opt level: O0

copy_ptr<cppcms::http::cookie::_data> * __thiscall
booster::copy_ptr<cppcms::http::cookie::_data>::operator=
          (copy_ptr<cppcms::http::cookie::_data> *this,copy_ptr<cppcms::http::cookie::_data> *other)

{
  copy_ptr<cppcms::http::cookie::_data> *in_RSI;
  copy_ptr<cppcms::http::cookie::_data> *in_RDI;
  copy_ptr<cppcms::http::cookie::_data> *unaff_retaddr;
  copy_ptr<cppcms::http::cookie::_data> tmp;
  copy_ptr<cppcms::http::cookie::_data> local_18 [2];
  
  if (in_RDI != in_RSI) {
    copy_ptr(unaff_retaddr,in_RDI);
    swap(in_RDI,local_18);
    ~copy_ptr(in_RDI);
  }
  return in_RDI;
}

Assistant:

copy_ptr const &operator=(copy_ptr const &other)
		{
			if(this != &other) {
				copy_ptr tmp(other);
				swap(tmp);
			}
			return *this;
		}